

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<double>::Decompose_Cholesky
          (TPZSkylMatrix<double> *this,list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  char cVar3;
  double **ppdVar4;
  double *pdVar5;
  double **ppdVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int extraout_var;
  double *pdVar9;
  ulong uVar10;
  _List_node_base *p_Var11;
  ostream *poVar12;
  _List_node_base *p_Var13;
  ulong uVar14;
  _List_node_base *p_Var15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  _List_node_base *p_Var21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  double extraout_XMM0_Qa;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  double dVar42;
  double dVar43;
  double dVar44;
  undefined1 auVar41 [16];
  double dVar45;
  double in_XMM7_Qa;
  double in_XMM7_Qb;
  undefined1 auVar46 [16];
  double local_58;
  double dStack_50;
  
  cVar3 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  if (cVar3 != '\0') {
    if (cVar3 == '\x03') {
      return 1;
    }
    TPZMatrix<double>::Error
              ("virtual int TPZSkylMatrix<double>::Decompose_Cholesky(std::list<int64_t> &) [TVar = double]"
               ,"Decompose_Cholesky <Matrix already Decomposed>");
  }
  std::__cxx11::list<long,_std::allocator<long>_>::clear(singular);
  iVar8 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  p_Var13 = (_List_node_base *)CONCAT44(extraout_var,iVar8);
  if (p_Var13 != (_List_node_base *)0x0 && -1 < extraout_var) {
    local_58 = 0.0;
    dStack_50 = -0.0;
    p_Var21 = (_List_node_base *)0x0;
    auVar26 = _DAT_014f8340;
    auVar46 = _DAT_014f8350;
    do {
      ppdVar4 = (this->fElem).fStore;
      pdVar9 = ppdVar4[(long)p_Var21];
      pdVar20 = ppdVar4[(long)((long)&p_Var21->_M_next + 1)];
      lVar24 = (long)pdVar20 - (long)pdVar9;
      if (lVar24 == 0) {
        return 0;
      }
      pdVar5 = (this->fElem).fStore[(long)p_Var21];
      dVar40 = 0.0;
      if (8 < lVar24) {
        pdVar9 = (double *)(((long)pdVar20 + (long)pdVar5) - (long)pdVar9);
        if (pdVar9 <= pdVar5 + 2) {
          pdVar9 = pdVar5 + 2;
        }
        uVar10 = (long)pdVar9 + (-9 - (long)pdVar5);
        auVar30._8_4_ = (int)uVar10;
        auVar30._0_8_ = uVar10;
        auVar30._12_4_ = (int)(uVar10 >> 0x20);
        auVar25._0_8_ = uVar10 >> 3;
        auVar25._8_8_ = auVar30._8_8_ >> 3;
        auVar25 = auVar25 ^ auVar46;
        uVar14 = 0;
        dVar40 = local_58;
        dVar43 = dStack_50;
        do {
          dVar42 = dVar43;
          dVar45 = dVar40;
          auVar29._8_4_ = (int)uVar14;
          auVar29._0_8_ = uVar14;
          auVar29._12_4_ = (int)(uVar14 >> 0x20);
          auVar30 = (auVar29 | auVar26) ^ auVar46;
          auVar34._0_4_ = -(uint)(auVar25._0_4_ < auVar30._0_4_);
          auVar34._4_4_ = -(uint)(auVar25._4_4_ < auVar30._4_4_);
          auVar34._8_4_ = -(uint)(auVar25._8_4_ < auVar30._8_4_);
          auVar34._12_4_ = -(uint)(auVar25._12_4_ < auVar30._12_4_);
          auVar31._4_4_ = -(uint)(auVar30._4_4_ == auVar25._4_4_);
          auVar31._12_4_ = -(uint)(auVar30._12_4_ == auVar25._12_4_);
          auVar31._0_4_ = auVar31._4_4_;
          auVar31._8_4_ = auVar31._12_4_;
          auVar32._4_4_ = auVar34._4_4_;
          auVar32._0_4_ = auVar34._4_4_;
          auVar32._8_4_ = auVar34._12_4_;
          auVar32._12_4_ = auVar34._12_4_;
          auVar30 = auVar31 & auVar34 | auVar32;
          dVar40 = dVar45;
          dVar43 = dVar42;
          if ((~auVar30._0_4_ & 1) != 0) {
            dVar40 = pdVar5[uVar14 + 1];
            dVar43 = 0.0;
          }
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          if (((auVar30 ^ auVar7) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            dVar43 = pdVar5[uVar14 + 2];
          }
          dVar40 = dVar40 * dVar40 + dVar45;
          dVar43 = dVar43 * dVar43 + dVar42;
          uVar14 = uVar14 + 2;
        } while (((uVar10 >> 3) + 2 & 0xfffffffffffffffe) != uVar14);
        auVar26._4_4_ = auVar34._0_4_;
        auVar26._0_4_ = auVar34._0_4_;
        auVar26._8_4_ = auVar34._8_4_;
        auVar26._12_4_ = auVar34._8_4_;
        auVar32 = auVar31 & auVar26 | auVar32;
        uVar10 = auVar32._0_8_;
        uVar14 = auVar32._8_8_;
        dVar40 = (double)(~uVar14 & (ulong)dVar43 | (ulong)dVar42 & uVar14) +
                 (double)(~uVar10 & (ulong)dVar40 | (ulong)dVar45 & uVar10);
      }
      dVar40 = *pdVar5 - dVar40;
      if (ABS(dVar40) < 1e-12) {
        p_Var11 = (_List_node_base *)operator_new(0x18);
        p_Var11[1]._M_next = p_Var21;
        std::__detail::_List_node_base::_M_hook(p_Var11);
        psVar1 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Decompose_Cholesky",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," Singular equation pivot ",0x19);
        poVar12 = std::ostream::_M_insert<double>(dVar40);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," k ",3);
        poVar12 = std::ostream::_M_insert<long>((long)poVar12);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        dVar40 = 1.0;
      }
      if (dVar40 < 0.0) {
        dVar40 = sqrt(dVar40);
      }
      else {
        dVar40 = SQRT(dVar40);
      }
      auVar46 = _DAT_014f8350;
      auVar26 = _DAT_014f8340;
      ppdVar4 = (this->fElem).fStore;
      pdVar9 = ppdVar4[(long)p_Var21];
      *pdVar9 = dVar40;
      p_Var11 = (_List_node_base *)((long)&p_Var21->_M_next + 1);
      if ((long)p_Var11 < (long)p_Var13) {
        ppdVar6 = (this->fElem).fStore;
        uVar10 = (ulong)((long)pdVar5 + (lVar24 - (long)pdVar9) + -8) >> 3;
        uVar16 = (uint)uVar10;
        uVar10 = uVar10 & 0xffffffff;
        lVar24 = 2;
        lVar17 = -0x10;
        lVar18 = 0x18;
        p_Var15 = p_Var21;
        do {
          lVar19 = (long)ppdVar6[(long)((long)&p_Var11->_M_next + 1)] - (long)ppdVar6[(long)p_Var11]
                   >> 3;
          if (lVar24 < lVar19) {
            pdVar20 = ppdVar4[(long)p_Var11];
            uVar23 = (uint)((ulong)((long)ppdVar4[(long)((long)&p_Var15->_M_next + 2)] -
                                   (long)(pdVar20 + lVar24)) >> 3);
            if (uVar16 < uVar23) {
              uVar23 = uVar16;
            }
            if (uVar23 == 0) {
              dVar43 = 0.0;
            }
            else {
              uVar14 = (ulong)((long)ppdVar4[(long)((long)&p_Var15->_M_next + 2)] +
                              (lVar17 - (long)pdVar20)) >> 3 & 0xffffffff;
              if (uVar10 < uVar14) {
                uVar14 = uVar10;
              }
              lVar19 = uVar14 - 1;
              auVar27._8_4_ = (int)lVar19;
              auVar27._0_8_ = lVar19;
              auVar27._12_4_ = (int)((ulong)lVar19 >> 0x20);
              uVar22 = 0;
              dVar43 = 0.0;
              dVar45 = -0.0;
              do {
                dVar44 = dVar45;
                dVar42 = dVar43;
                auVar35._8_4_ = (int)uVar22;
                auVar35._0_8_ = uVar22;
                auVar35._12_4_ = (int)(uVar22 >> 0x20);
                auVar41 = auVar27 ^ auVar46;
                auVar30 = (auVar35 | auVar26) ^ auVar46;
                auVar39._0_4_ = -(uint)(auVar41._0_4_ < auVar30._0_4_);
                auVar39._4_4_ = -(uint)(auVar41._4_4_ < auVar30._4_4_);
                auVar39._8_4_ = -(uint)(auVar41._8_4_ < auVar30._8_4_);
                auVar39._12_4_ = -(uint)(auVar41._12_4_ < auVar30._12_4_);
                auVar36._4_4_ = -(uint)(auVar30._4_4_ == auVar41._4_4_);
                auVar36._12_4_ = -(uint)(auVar30._12_4_ == auVar41._12_4_);
                auVar36._0_4_ = auVar36._4_4_;
                auVar36._8_4_ = auVar36._12_4_;
                auVar37._4_4_ = auVar39._4_4_;
                auVar37._0_4_ = auVar39._4_4_;
                auVar37._8_4_ = auVar39._12_4_;
                auVar37._12_4_ = auVar39._12_4_;
                auVar30 = auVar36 & auVar39 | auVar37;
                if ((~auVar30._0_4_ & 1) != 0) {
                  auVar41._8_8_ = 0;
                  auVar41._0_8_ = *(ulong *)((long)pdVar20 + uVar22 * 8 + lVar18 + -8);
                  in_XMM7_Qa = pdVar9[uVar22 + 1];
                  in_XMM7_Qb = 0.0;
                }
                if (((auVar30._8_2_ ^ 0xffff) & 1) != 0) {
                  auVar41._8_8_ = *(undefined8 *)((long)pdVar20 + uVar22 * 8 + lVar18);
                  in_XMM7_Qb = pdVar9[uVar22 + 2];
                }
                dVar43 = auVar41._0_8_ * in_XMM7_Qa + dVar42;
                dVar45 = auVar41._8_8_ * in_XMM7_Qb + dVar44;
                uVar22 = uVar22 + 2;
              } while ((uVar14 + 1 & 0xfffffffffffffffe) != uVar22);
              auVar28._4_4_ = auVar39._0_4_;
              auVar28._0_4_ = auVar39._0_4_;
              auVar28._8_4_ = auVar39._8_4_;
              auVar28._12_4_ = auVar39._8_4_;
              auVar37 = auVar36 & auVar28 | auVar37;
              uVar14 = auVar37._0_8_;
              auVar33._0_8_ = (ulong)dVar42 & uVar14;
              uVar22 = auVar37._8_8_;
              auVar33._8_8_ = (ulong)dVar44 & uVar22;
              auVar38._0_8_ = ~uVar14 & (ulong)dVar43;
              auVar38._8_8_ = ~uVar22 & (ulong)dVar45;
              dVar43 = SUB168(auVar38 | auVar33,8) + SUB168(auVar38 | auVar33,0);
            }
            pdVar20 = pdVar20 + lVar24 + -1;
            dVar43 = *pdVar20 - dVar43;
LAB_00cc23e3:
            *pdVar20 = dVar43 / dVar40;
          }
          else if (lVar19 == lVar24) {
            pdVar20 = ppdVar4[(long)p_Var11] + lVar24 + -1;
            dVar43 = *pdVar20;
            goto LAB_00cc23e3;
          }
          lVar24 = lVar24 + 1;
          p_Var2 = (_List_node_base *)((long)&p_Var11->_M_next + 1);
          lVar17 = lVar17 + -8;
          lVar18 = lVar18 + 8;
          p_Var15 = p_Var11;
          p_Var11 = p_Var2;
        } while ((long)p_Var2 < (long)p_Var13);
      }
      p_Var21 = (_List_node_base *)((long)&p_Var21->_M_next + 1);
    } while (p_Var21 != p_Var13);
  }
  lVar24 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar24 != 0) &&
     ((*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
                (this,lVar24 + -1), ABS(extraout_XMM0_Qa) < 1e-15)) {
    lVar24 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    p_Var13 = (_List_node_base *)operator_new(0x18);
    p_Var13[1]._M_next = (_List_node_base *)(lVar24 + -1);
    std::__detail::_List_node_base::_M_hook(p_Var13);
    psVar1 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23])
              (this,(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + -1);
  }
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\x03';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\x01';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular)
{
	if(this->fDecomposed == ECholesky) return 1;
	if (  this->fDecomposed )  TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_Cholesky <Matrix already Decomposed>" );
    
#ifdef DUMP_BEFORE_DECOMPOSE
	dump_matrix(this, "TPZSkylMatrix::Decompose_Cholesky(singular)");
#endif
    
	singular.clear();
	TVar pivot;
	RTVar Tol;
	ZeroTolerance(Tol);
	int64_t dimension = this->Dim();
	/*  if(Dim() > 100) {
	 cout << "\nTPZSkylMatrix Cholesky decomposition Dim = " << Dim() << endl;
	 cout.flush();
	 }*/
	for ( int64_t k = 0; k < dimension; k++ )
	{
		/*    if(!(k%100) && Dim() > 100) {
		 cout <<  k << ' ';
		 cout.flush();
		 }
		 if(!(k%1000)) cout << endl;*/
		if ( Size(k) == 0 )	return( 0 );
		
		// Faz sum = SOMA( A(k,p) * A(k,p) ), p = 1, ..., k-1.
		//
		TVar sum = 0.0;
		TVar *elem_k = fElem[k]+1;
		TVar *end_k  = fElem[k]+Size(k);
        if constexpr (is_complex<TVar>::value){
            for ( ; elem_k < end_k; elem_k++ ) sum += std::conj(*elem_k) * (*elem_k);
        }else{
#pragma clang loop vectorize_width(2)
            for ( ; elem_k < end_k; elem_k++ ) sum += (*elem_k) * (*elem_k);
        }

		
		// Faz A(k,k) = sqrt( A(k,k) - sum ).
		//
		pivot = fElem[k][0] - sum;
        //		if ( pivot < ((TVar)1.e-9) ) {
		if(abs(pivot) < Tol) {
			singular.push_back(k);
            std::cout << __FUNCTION__ << " Singular equation pivot " << pivot << " k " << k << std::endl;
			pivot = 1.;
		}
		// A matriz nao e' definida positiva.
		
		pivot = fElem[k][0] = sqrt( pivot );
		
		// Loop para i = k+1 ... Dim().
		//
		int64_t i=k+1;
		for ( int64_t j = 2; i<dimension; j++,i++ ) {
			// Se tiverem elementos na linha 'i' cuja coluna e'
			//  menor do que 'K'...
			if ( Size(i) > j ) {
				// Faz sum = SOMA( A(i,p) * A(k,p) ), p = 1,..,k-1.
				sum = 0.0;
				TVar *elem_i = &fElem[i][j];
				TVar *end_i  = fElem[i+1];
				elem_k = &(fElem[k][1]);
				// Vectorizable loop
				unsigned max_l = end_i - elem_i;
				unsigned tmp = end_k - elem_k;
				if (tmp < max_l) max_l = tmp;
                if constexpr (is_complex<TVar>::value){
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * std::conj(*elem_k++);
                }else{
#pragma clang loop vectorize_width(2)
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * (*elem_k++);
                }

				// Faz A(i,k) = (A(i,k) - sum) / A(k,k)
				fElem[i][j-1] = (fElem[i][j-1] -sum) / pivot;
			} else if ( Size(i) == j ) fElem[i][j-1] /= pivot;
			
			// Se nao tiverem estes elementos, sum = 0.0.
			
			// Se nao existir nem o elemento A(i,k), nao faz nada.
		}
	}
	
	if(this->Rows() && fabs(GetVal(this->Rows()-1,this->Rows()-1)) < fabs((TVar)1.e-15))
	{
		singular.push_back(this->Rows()-1);
		PutVal(this->Rows()-1,this->Rows()-1,1.);
	}
	this->fDecomposed  = ECholesky;
	this->fDefPositive = 1;
	return( 1 );
}